

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O0

econf_err getDoubleValueNum(econf_file key_file,size_t num,double *result)

{
  int *piVar1;
  double dVar2;
  char *local_28;
  char *endptr;
  double *result_local;
  size_t num_local;
  
  endptr = (char *)result;
  result_local = (double *)num;
  piVar1 = __errno_location();
  *piVar1 = 0;
  dVar2 = strtod(key_file.file_entry[(long)result_local].value,&local_28);
  *(double *)endptr = dVar2;
  if (((local_28 != key_file.file_entry[(long)result_local].value) &&
      (piVar1 = __errno_location(), *piVar1 != 0x22)) &&
     ((piVar1 = __errno_location(), *piVar1 == 0 ||
      ((*(double *)endptr != 0.0 || (NAN(*(double *)endptr))))))) {
    return ECONF_SUCCESS;
  }
  return ECONF_VALUE_CONVERSION_ERROR;
}

Assistant:

econf_err getDoubleValueNum(econf_file key_file, size_t num, double *result) {
  char *endptr;
  errno = 0;
  *result = strtod(key_file.file_entry[num].value, &endptr);
  if (endptr == key_file.file_entry[num].value || errno == ERANGE || (errno != 0 && *result == 0))
    return ECONF_VALUE_CONVERSION_ERROR;
  return ECONF_SUCCESS;
}